

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbenchmarkperfevents.cpp
# Opt level: O3

void __thiscall
QBenchmarkPerfEventsMeasurer::~QBenchmarkPerfEventsMeasurer(QBenchmarkPerfEventsMeasurer *this)

{
  int *piVar1;
  int __fd;
  long lVar2;
  Data *pDVar3;
  int iVar4;
  int *piVar5;
  int *piVar6;
  
  (this->super_QBenchmarkMeasurerBase)._vptr_QBenchmarkMeasurerBase =
       (_func_int **)&PTR__QBenchmarkPerfEventsMeasurer_0016f1a8;
  lVar2 = (this->fds).d.size;
  if (lVar2 != 0) {
    piVar6 = (this->fds).d.ptr;
    piVar1 = piVar6 + lVar2;
    do {
      __fd = *piVar6;
      do {
        iVar4 = close(__fd);
        if (iVar4 != -1) break;
        piVar5 = __errno_location();
      } while (*piVar5 == 4);
      piVar6 = piVar6 + 1;
    } while (piVar6 != piVar1);
  }
  pDVar3 = (this->fds).d.d;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->fds).d.d)->super_QArrayData,4,0x10);
      return;
    }
  }
  return;
}

Assistant:

QBenchmarkPerfEventsMeasurer::~QBenchmarkPerfEventsMeasurer()
{
    for (int fd : std::as_const(fds))
        qt_safe_close(fd);
}